

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall enact::Lexer::skipWhitespace(Lexer *this)

{
  byte bVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  line_t lVar8;
  
  pcVar2 = (this->m_source)._M_dataplus._M_p;
  lVar8 = this->m_line;
  iVar7 = *(int *)&this->m_col;
  uVar5 = this->m_current;
  do {
    iVar7 = iVar7 + 1;
    uVar6 = uVar5 + 1;
    bVar1 = pcVar2[uVar5];
    if (bVar1 < 0xd) {
      if (bVar1 != 9) {
        if (bVar1 != 10) {
          return;
        }
        lVar8 = lVar8 + 1;
        this->m_line = lVar8;
      }
    }
    else if ((bVar1 != 0xd) && (bVar1 != 0x20)) {
      if ((bVar1 == 0x2f) && (pcVar2[uVar6] == '/')) {
        uVar3 = (this->m_source)._M_string_length;
        while (uVar4 = uVar6, uVar5 < uVar3) {
          this->m_col = (col_t)iVar7;
          this->m_current = uVar4;
          if (pcVar2[uVar4] == '\n') {
            return;
          }
          iVar7 = iVar7 + 1;
          uVar6 = uVar4 + 1;
          uVar5 = uVar4;
        }
      }
      return;
    }
    this->m_col = (col_t)iVar7;
    this->m_current = uVar6;
    uVar5 = uVar6;
  } while( true );
}

Assistant:

void Lexer::skipWhitespace() {
        while (true) {
            char c = peek();
            switch (c) {
                case '\n':
                    ++m_line;
                    // Fallthrough
                case ' ':
                case '\t':
                case '\r':
                    advance();
                    break;

                case '/':
                    if (peekNext() == '/') {
                        while (peek() != '\n' && !isAtEnd()) advance();
                    } else {
                        return;
                    }

                default:
                    return;
            }
        }
    }